

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata_impl.h
# Opt level: O0

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
::detach(QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
         *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
  *pQVar4;
  totally_ordered_wrapper<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_*>
  *in_RDI;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
  copy;
  QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
  *in_stack_ffffffffffffffc8;
  QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = Qt::totally_ordered_wrapper::operator_cast_to_bool
                    ((totally_ordered_wrapper<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_*>
                      *)0x31234a);
  if (bVar2) {
    Qt::
    totally_ordered_wrapper<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_*>
    ::operator->((totally_ordered_wrapper<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_*>
                  *)0x312392);
    iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x31239a);
    if (iVar3 != 1) {
      pQVar4 = (QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
                *)operator_new(0x38);
      Qt::
      totally_ordered_wrapper<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_*>
      ::
      operator*<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>,_true>
                ((totally_ordered_wrapper<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_*>
                  *)0x3123c4);
      QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
      ::QMapData(pQVar4,in_stack_ffffffffffffffc8);
      QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
                  *)pQVar4,in_stack_ffffffffffffffc8);
      swap((QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
            *)pQVar4,
           (QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
            *)in_stack_ffffffffffffffc8);
      ~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
                  *)pQVar4);
    }
  }
  else {
    pQVar4 = (QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
              *)operator_new(0x38);
    QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>
    ::QMapData(in_stack_ffffffffffffffd0);
    Qt::
    totally_ordered_wrapper<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_*>
    ::reset(in_RDI,pQVar4);
    Qt::
    totally_ordered_wrapper<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_*>
    ::operator->((totally_ordered_wrapper<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_*>
                  *)0x31237e);
    QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x312386);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void detach()
    {
        if (!d) {
            // should this codepath be here on in all user's detach()?
            d.reset(new T);
            d->ref.ref();
        } else if (d->ref.loadRelaxed() != 1) {
            // TODO: qAtomicDetach here...?
            QExplicitlySharedDataPointerV2 copy(new T(*d));
            swap(copy);
        }
    }